

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O0

void de::createDirectory(char *path)

{
  bool bVar1;
  Type TVar2;
  runtime_error *prVar3;
  string local_a0;
  undefined1 local_80 [8];
  FilePath parentPath;
  FilePath local_50;
  undefined1 local_30 [8];
  FilePath dirPath;
  char *path_local;
  
  dirPath.m_path.field_2._8_8_ = path;
  FilePath::FilePath(&local_50,path);
  FilePath::normalize((FilePath *)local_30,&local_50);
  FilePath::~FilePath(&local_50);
  FilePath::getDirName_abi_cxx11_(&local_a0,(FilePath *)local_30);
  FilePath::FilePath((FilePath *)local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  bVar1 = FilePath::exists((FilePath *)local_30);
  if (bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Destination exists already");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = FilePath::exists((FilePath *)local_80);
  if (!bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Parent directory doesn\'t exist");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  TVar2 = FilePath::getType((FilePath *)local_80);
  if (TVar2 != TYPE_DIRECTORY) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Parent is not directory");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  createDirectoryImpl((char *)dirPath.m_path.field_2._8_8_);
  FilePath::~FilePath((FilePath *)local_80);
  FilePath::~FilePath((FilePath *)local_30);
  return;
}

Assistant:

void createDirectory (const char* path)
{
	FilePath	dirPath		= FilePath::normalize(path);
	FilePath	parentPath	(dirPath.getDirName());

	if (dirPath.exists())
		throw std::runtime_error("Destination exists already");
	else if (!parentPath.exists())
		throw std::runtime_error("Parent directory doesn't exist");
	else if (parentPath.getType() != FilePath::TYPE_DIRECTORY)
		throw std::runtime_error("Parent is not directory");

	createDirectoryImpl(path);
}